

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_policy.cpp
# Opt level: O3

ACT_TYPE __thiscall
despot::MajorityActionPolicy::Action
          (MajorityActionPolicy *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  double dVar1;
  State *pSVar2;
  int iVar3;
  pointer ppSVar4;
  ulong uVar5;
  ACT_TYPE AVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  vector<double,_std::allocator<double>_> frequencies;
  allocator_type local_39;
  vector<double,_std::allocator<double>_> local_38;
  
  iVar3 = (*((this->super_DefaultPolicy).super_ScenarioLowerBound.model_)->_vptr_DSPOMDP[5])();
  std::vector<double,_std::allocator<double>_>::vector(&local_38,(long)iVar3,&local_39);
  ppSVar4 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppSVar4) {
    uVar8 = 0;
    do {
      pSVar2 = ppSVar4[uVar8];
      iVar3 = (*this->policy_->_vptr_StatePolicy[2])(this->policy_,pSVar2);
      local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar3] =
           pSVar2->weight +
           local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar3];
      uVar8 = uVar8 + 1;
      ppSVar4 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(particles->
                                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4 >> 3)
            );
  }
  uVar8 = (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  AVar6 = 0;
  if (1 < uVar8) {
    dVar9 = *local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = 0;
    uVar5 = 1;
    do {
      dVar1 = local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5];
      if (dVar9 < dVar1) {
        uVar7 = uVar5 & 0xffffffff;
      }
      AVar6 = (ACT_TYPE)uVar7;
      if (dVar1 <= dVar9) {
        dVar1 = dVar9;
      }
      dVar9 = dVar1;
      uVar5 = uVar5 + 1;
    } while (uVar8 != uVar5);
  }
  operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return AVar6;
}

Assistant:

ACT_TYPE MajorityActionPolicy::Action(const vector<State*>& particles,
	RandomStreams& streams, History& history) const {
	vector<double> frequencies(model_->NumActions());

	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		ACT_TYPE action = policy_.GetAction(*particle);
		frequencies[action] += particle->weight;
	}

	int bestAction = 0;
	double bestWeight = frequencies[0];
	for (int a = 1; a < frequencies.size(); a++) {
		if (bestWeight < frequencies[a]) {
			bestWeight = frequencies[a];
			bestAction = a;
		}
	}

	return bestAction;
}